

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

string * testing::internal::StreamableToString<int>(string *__return_storage_ptr__,int *streamable)

{
  Message *this;
  Message local_20;
  int *local_18;
  int *streamable_local;
  
  local_18 = streamable;
  streamable_local = (int *)__return_storage_ptr__;
  Message::Message(&local_20);
  this = Message::operator<<(&local_20,local_18);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,this);
  Message::~Message((Message *)0x1cbf53);
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}